

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

bool __thiscall Am_Inter_Location::operator&&(Am_Inter_Location *this,Am_Inter_Location *test)

{
  int iVar1;
  Am_Inter_Location_Data *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  pAVar2 = test->data;
  if (pAVar2 == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  iVar4 = (pAVar2->data).rect.left;
  iVar9 = (pAVar2->data).rect.top;
  iVar6 = (pAVar2->data).rect.width;
  iVar5 = (pAVar2->data).rect.height;
  if (pAVar2->as_line == true) {
    iVar8 = iVar6;
    if (iVar4 < iVar6) {
      iVar8 = iVar4;
    }
    if (iVar6 < iVar4) {
      iVar6 = iVar4;
    }
    iVar4 = iVar5;
    if (iVar9 < iVar5) {
      iVar4 = iVar9;
    }
    if (iVar5 < iVar9) {
      iVar5 = iVar9;
    }
  }
  else {
    iVar6 = iVar6 + iVar4;
    iVar8 = iVar4;
    iVar4 = iVar9;
    iVar5 = iVar5 + iVar9;
  }
  pAVar2 = this->data;
  iVar9 = (pAVar2->data).rect.left;
  iVar1 = (pAVar2->data).rect.top;
  iVar10 = (pAVar2->data).rect.width;
  iVar7 = (pAVar2->data).rect.height;
  if (pAVar2->as_line == true) {
    iVar11 = iVar10;
    if (iVar9 < iVar10) {
      iVar11 = iVar9;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    iVar9 = iVar7;
    if (iVar1 < iVar7) {
      iVar9 = iVar1;
    }
    if (iVar7 < iVar1) {
      iVar7 = iVar1;
    }
  }
  else {
    iVar10 = iVar10 + iVar9;
    iVar11 = iVar9;
    iVar9 = iVar1;
    iVar7 = iVar7 + iVar1;
  }
  bVar3 = false;
  if (((iVar11 < iVar6) && (bVar3 = false, iVar8 <= iVar10)) && (iVar9 < iVar5)) {
    bVar3 = iVar4 <= iVar7;
  }
  return bVar3;
}

Assistant:

void
Am_Inter_Location::Get_Points(int &a, int &b, int &c, int &d) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  a = data->data.line.x1;
  b = data->data.line.y1;
  c = data->data.line.x2;
  d = data->data.line.y2;
}